

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

statement_base * __thiscall
cs::method_for_do::translate
          (method_for_do *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  value_type ptVar1;
  token_base *ptVar2;
  instance_type *this_00;
  _Elt_pointer pdVar3;
  int iVar4;
  const_reference pptVar5;
  token_base **pptVar6;
  size_type sVar7;
  reference ptVar8;
  statement_for *this_01;
  statement_expression *this_02;
  _Elt_pointer pptVar9;
  internal_error *this_03;
  compile_error *pcVar10;
  iterator it;
  token_base *this_04;
  initializer_list<cs::statement_base_*> __l;
  allocator_type local_119;
  tree_type<cs::token_base_*> local_118;
  string local_110;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_e0;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_d0;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> local_80
  ;
  
  pptVar5 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar1 = *pptVar5;
  local_110._M_dataplus._M_p = (pointer)ptVar1[1]._vptr_token_base;
  pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_110);
  if (*pptVar6 == (token_base *)0x0) {
    this_03 = (internal_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_110,"Null pointer accessed.",(allocator *)&local_119);
    internal_error::internal_error(this_03,&local_110);
    __cxa_throw(this_03,&internal_error::typeinfo,internal_error::~internal_error);
  }
  local_110._M_dataplus._M_p = (pointer)ptVar1[1]._vptr_token_base;
  pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_110);
  iVar4 = (*(*pptVar6)->_vptr_token_base[2])();
  if (iVar4 == 0xf) {
    local_110._M_dataplus._M_p = (pointer)ptVar1[1]._vptr_token_base;
    pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_110);
    ptVar2 = *pptVar6;
    this_04 = ptVar2 + 1;
    sVar7 = std::
            deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
            ::size((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                    *)this_04);
    if (sVar7 == 3) {
      this_00 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 )->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      ptVar8 = std::
               _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
               ::operator[]((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                             *)(ptVar2 + 2),0);
      it.mData = ptVar8->mRoot;
      instance_type::check_define_var(this_00,it,false,false);
      this_01 = (statement_for *)
                statement_base::operator_new((statement_base *)0xc0,(size_t)it.mData);
      std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
      ::deque(&local_80,
              (deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
               *)this_04);
      this_02 = (statement_expression *)
                statement_base::operator_new((statement_base *)0x28,(size_t)this_04);
      pptVar5 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                          ((raw->
                           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                           )._M_impl.super__Deque_impl_data._M_start._M_cur,3);
      tree_type<cs::token_base_*>::tree_type
                (&local_118,(tree_type<cs::token_base_*> *)(*pptVar5 + 1));
      std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_e0,
                 &context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>);
      pdVar3 = (raw->
               super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
               )._M_impl.super__Deque_impl_data._M_start._M_cur;
      pptVar9 = (pdVar3->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pptVar9 ==
          (pdVar3->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        pptVar9 = (pdVar3->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      statement_expression::statement_expression
                (this_02,&local_118,(context_t *)&local_e0,pptVar9[-1]);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_110;
      local_110._M_dataplus._M_p = (pointer)this_02;
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_d0,__l
                 ,&local_119);
      std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_f0,
                 &context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>);
      pdVar3 = (raw->
               super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
               )._M_impl.super__Deque_impl_data._M_start._M_cur;
      pptVar9 = (pdVar3->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pptVar9 ==
          (pdVar3->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        pptVar9 = (pdVar3->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      statement_for::statement_for
                (this_01,&local_80,
                 (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_d0,
                 (context_t *)&local_f0,pptVar9[-1]);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
      std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                (&local_d0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
      tree_type<cs::token_base_*>::~tree_type(&local_118);
      std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
      ::~deque(&local_80);
      return &this_01->super_statement_base;
    }
    pcVar10 = (compile_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_110,
               "Wrong grammar in for statement, expect <id> = <expression>, <condition>, <process>",
               (allocator *)&local_119);
    compile_error::compile_error(pcVar10,&local_110);
    __cxa_throw(pcVar10,&compile_error::typeinfo,compile_error::~compile_error);
  }
  pcVar10 = (compile_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_110,
             "Wrong grammar in for statement, expect <id> = <expression>, <condition>, <process>",
             (allocator *)&local_119);
  compile_error::compile_error(pcVar10,&local_110);
  __cxa_throw(pcVar10,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

statement_base *
	method_for_do::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (tree.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (tree.root().data()->get_type() != token_types::parallel)
			throw compile_error("Wrong grammar in for statement, expect <id> = <expression>, <condition>, <process>");
		auto &parallel_list = static_cast<token_parallel *>(tree.root().data())->get_parallel();
		if (parallel_list.size() != 3)
			throw compile_error("Wrong grammar in for statement, expect <id> = <expression>, <condition>, <process>");
		context->instance->check_define_var(parallel_list[0].root());
		return new statement_for(parallel_list, {
			new statement_expression(static_cast<token_expr *>(raw.front().at(3))->get_tree(),
			                         context, raw.front().back())
		}, context, raw.front().back());
	}